

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void ffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  bool bVar9;
  float fVar10;
  byte bVar11;
  byte bVar12;
  long StageCnt;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  long unaff_RBX;
  ulong uVar22;
  long unaff_RBP;
  unsigned_long posA;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  float *pfVar26;
  float *pfVar27;
  long in_R10;
  long in_R11;
  long lVar28;
  long unaff_R12;
  ulong uVar29;
  long unaff_R13;
  long unaff_R14;
  ulong uVar30;
  long lVar31;
  long unaff_R15;
  ushort uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar63 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  float *pstrt;
  unsigned_long Nrems2;
  unsigned_long Nroot_1_ColInc;
  unsigned_long posAi;
  unsigned_long ColstartShift;
  float *local_178;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_b8;
  undefined1 auStack_b0 [56];
  undefined1 auVar62 [64];
  undefined1 auVar64 [64];
  
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar78 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = 0;
      auVar79 = vpbroadcastq_avx512f();
      do {
        auVar80 = vpbroadcastq_avx512f();
        uVar13 = uVar13 + 0x10;
        auVar61 = vporq_avx512f(auVar80,auVar57);
        auVar80 = vporq_avx512f(auVar80,auVar78);
        uVar2 = vpcmpuq_avx512f(auVar80,auVar79,2);
        bVar11 = (byte)uVar2;
        uVar2 = vpcmpuq_avx512f(auVar61,auVar79,2);
        bVar12 = (byte)uVar2;
        uVar32 = CONCAT11(bVar12,bVar11);
        uVar23 = (ulong)uVar32;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX));
        auVar45._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar45._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar45._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar45._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar45._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar45._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar45._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar45._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar45._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar45._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar45._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar45._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar45._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar45._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar45._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar45._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX + 4));
        auVar46._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar46._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar46._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar46._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar46._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar46._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar46._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar46._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar46._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar46._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar46._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar46._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar46._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar46._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar46._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar46._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*ioptr);
        auVar47._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar47._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar47._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar47._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar47._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar47._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar47._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar47._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar47._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar47._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar47._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar47._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar47._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar47._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar47._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar47._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBP));
        auVar48._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar48._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar48._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar48._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar48._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar48._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar48._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar48._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar48._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar48._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar48._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar48._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar48._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar48._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar48._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar48._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vaddps_avx512f(auVar47,auVar45);
        auVar61 = vsubps_avx512f(auVar45,auVar47);
        auVar63 = vaddps_avx512f(auVar48,auVar46);
        auVar67 = vsubps_avx512f(auVar46,auVar48);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108940,uVar23,auVar80);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108a00,uVar23,auVar63);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108980,uVar23,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_001089c0,uVar23,auVar67);
        ioptr = ioptr + 0x40;
      } while ((Rows + 0xfU & 0xfffffffffffffff0) != uVar13);
    }
    break;
  case 2:
    if (0 < Rows) {
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar78 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = 0;
      auVar79 = vpbroadcastq_avx512f();
      do {
        auVar80 = vpbroadcastq_avx512f();
        auVar33 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar34 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar35 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        uVar13 = uVar13 + 0x10;
        auVar61 = vporq_avx512f(auVar80,auVar57);
        auVar80 = vporq_avx512f(auVar80,auVar78);
        uVar2 = vpcmpuq_avx512f(auVar80,auVar79,2);
        bVar11 = (byte)uVar2;
        uVar2 = vpcmpuq_avx512f(auVar61,auVar79,2);
        bVar12 = (byte)uVar2;
        uVar32 = CONCAT11(bVar12,bVar11);
        uVar23 = (ulong)uVar32;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX));
        auVar49._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar49._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar49._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar49._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar49._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar49._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar49._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar49._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar49._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar49._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar49._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar49._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar49._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar49._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar49._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar49._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX + 4));
        auVar50._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar50._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar50._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar50._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar50._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar50._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar50._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar50._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar50._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar50._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar50._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar50._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar50._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar50._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar50._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar50._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*ioptr);
        auVar51._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar51._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar51._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar51._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar51._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar51._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar51._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar51._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar51._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar51._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar51._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar51._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar51._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar51._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar51._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar51._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBP));
        auVar52._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar52._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar52._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar52._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar52._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar52._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar52._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar52._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar52._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar52._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar52._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar52._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar52._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar52._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar52._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar52._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + M));
        auVar53._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar80._4_4_;
        auVar53._0_4_ = (uint)(bVar11 & 1) * auVar80._0_4_;
        auVar53._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar80._8_4_;
        auVar53._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar80._12_4_;
        auVar53._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar53._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar53._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar53._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar53._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar53._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar53._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar53._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar53._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar53._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar53._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar53._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr * 2));
        auVar54._0_4_ =
             (uint)(bVar11 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar33._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar9 * auVar80._4_4_ | (uint)!bVar9 * auVar33._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar9 * auVar80._8_4_ | (uint)!bVar9 * auVar33._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar9 * auVar80._12_4_ | (uint)!bVar9 * auVar33._12_4_;
        auVar54._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar54._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar54._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar54._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar54._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar54._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar54._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar54._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar54._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar54._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar54._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar54._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + (long)BRLow));
        auVar55._0_4_ =
             (uint)(bVar11 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar34._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar9 * auVar80._4_4_ | (uint)!bVar9 * auVar34._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar9 * auVar80._8_4_ | (uint)!bVar9 * auVar34._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar9 * auVar80._12_4_ | (uint)!bVar9 * auVar34._12_4_;
        auVar55._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar55._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar55._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar55._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar55._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar55._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar55._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar55._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar55._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar55._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar55._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar55._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + Rows + -1));
        auVar56._0_4_ =
             (uint)(bVar11 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar35._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar9 * auVar80._4_4_ | (uint)!bVar9 * auVar35._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar9 * auVar80._8_4_ | (uint)!bVar9 * auVar35._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar9 * auVar80._12_4_ | (uint)!bVar9 * auVar35._12_4_;
        auVar56._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar80._16_4_;
        auVar56._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar80._20_4_;
        auVar56._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar80._24_4_;
        auVar56._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar80._28_4_;
        auVar56._32_4_ = (uint)(bVar12 & 1) * auVar80._32_4_;
        auVar56._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar80._36_4_;
        auVar56._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar80._40_4_;
        auVar56._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar80._44_4_;
        auVar56._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar80._48_4_;
        auVar56._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar80._52_4_;
        auVar56._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar80._56_4_;
        auVar56._60_4_ = (uint)(bVar12 >> 7) * auVar80._60_4_;
        auVar80 = vaddps_avx512f(auVar51,auVar49);
        auVar61 = vsubps_avx512f(auVar49,auVar51);
        auVar63 = vaddps_avx512f(auVar52,auVar50);
        auVar67 = vsubps_avx512f(auVar50,auVar52);
        auVar89 = vsubps_avx512f(auVar53,auVar55);
        auVar90 = vaddps_avx512f(auVar55,auVar53);
        auVar81 = vsubps_avx512f(auVar54,auVar56);
        auVar82 = vaddps_avx512f(auVar56,auVar54);
        in_ZMM17 = vaddps_avx512f(auVar90,auVar80);
        auVar80 = vsubps_avx512f(auVar80,auVar90);
        in_ZMM18 = vaddps_avx512f(auVar82,auVar63);
        auVar90 = vsubps_avx512f(auVar61,auVar81);
        auVar61 = vaddps_avx512f(auVar81,auVar61);
        in_ZMM16 = vsubps_avx512f(auVar63,auVar82);
        auVar63 = vaddps_avx512f(auVar89,auVar67);
        auVar67 = vsubps_avx512f(auVar67,auVar89);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108740,uVar23,in_ZMM17);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108900,uVar23,in_ZMM18);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108800,uVar23,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108840,uVar23,auVar67);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108780,uVar23,auVar80);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_001087c0,uVar23,in_ZMM16);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108880,uVar23,auVar90);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_001088c0,uVar23,auVar63);
        ioptr = ioptr + 0x80;
      } while ((Rows + 0xfU & 0xfffffffffffffff0) != uVar13);
    }
    break;
  case 3:
    if (0 < Rows) {
      uVar23 = 0;
      uVar13 = Rows + 0xfU & 0xfffffffffffffff0;
      auVar57 = vpbroadcastq_avx512f();
      auVar57 = vmovdqu64_avx512f(auVar57);
      do {
        auVar78 = vpbroadcastq_avx512f();
        auVar79 = vporq_avx512f(auVar78,_DAT_001082c0);
        auVar80 = vmovdqu64_avx512f(auVar57);
        auVar78 = vporq_avx512f(auVar78,_DAT_00108300);
        auVar33 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        auVar34 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
        auVar35 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar36 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
        auVar37 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
        auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        auVar39 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        auVar40 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        auVar41 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar42 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        uVar23 = uVar23 + 0x10;
        uVar2 = vpcmpuq_avx512f(auVar78,auVar80,2);
        bVar11 = (byte)uVar2;
        uVar2 = vpcmpuq_avx512f(auVar79,auVar80,2);
        bVar12 = (byte)uVar2;
        auVar43 = vpxord_avx512vl(auVar78._0_16_,auVar78._0_16_);
        auVar44 = vpxord_avx512vl(auVar79._0_16_,auVar79._0_16_);
        uVar32 = CONCAT11(bVar12,bVar11);
        uVar30 = (ulong)uVar32;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar13));
        auVar79._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar43._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar43._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar79._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar43._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar79._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar43._12_4_;
        auVar79._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar79._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar79._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar79._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar79._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar79._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar79._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar79._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar79._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar79._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar79._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar79._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar13 + 4));
        auVar80._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar44._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar80._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar44._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar80._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar44._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar80._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar44._12_4_;
        auVar80._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar80._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar80._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar80._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar80._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar80._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar80._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar80._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar80._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar80._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar80._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar80._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + (long)BRLow));
        auVar61._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar33._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar33._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar33._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar33._12_4_;
        auVar61._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar61._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar61._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar61._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar61._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar61._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar61._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar61._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar61._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar61._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar61._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar61._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + Rows + -1));
        auVar63._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar34._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar63._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar34._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar63._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar34._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar63._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar34._12_4_;
        auVar63._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar63._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar63._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar63._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar63._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar63._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar63._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar63._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar63._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar63._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar63._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar63._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R10));
        auVar67._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar35._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar35._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar35._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar35._12_4_;
        auVar67._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar67._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar67._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar67._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar67._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar67._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar67._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar67._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar67._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar67._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar67._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar67._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R11));
        auVar58._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar36._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar36._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar36._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar36._12_4_;
        auVar58._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar58._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar58._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar58._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar58._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar58._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar58._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar58._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar58._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar58._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar58._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar58._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R12));
        auVar59._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar37._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar37._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar37._12_4_;
        auVar59._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar59._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar59._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar59._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar59._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar59._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar59._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar59._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar59._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar59._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar59._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar59._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R13));
        auVar60._0_4_ =
             (uint)(bVar11 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar38._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar38._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar38._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar38._12_4_;
        auVar60._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar60._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar60._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar60._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar60._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar60._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar60._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar60._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar60._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar60._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar60._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar60._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar78 = vaddps_avx512f(auVar61,auVar79);
        auVar79 = vsubps_avx512f(auVar79,auVar61);
        auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R14));
        auVar62._0_4_ =
             (uint)(bVar11 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar9 * auVar61._4_4_ | (uint)!bVar9 * auVar39._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar9 * auVar61._8_4_ | (uint)!bVar9 * auVar39._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar62._12_4_ = (uint)bVar9 * auVar61._12_4_ | (uint)!bVar9 * auVar39._12_4_;
        auVar62._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar61._16_4_;
        auVar62._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar61._20_4_;
        auVar62._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar61._24_4_;
        auVar62._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar61._28_4_;
        auVar62._32_4_ = (uint)(bVar12 & 1) * auVar61._32_4_;
        auVar62._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar61._36_4_;
        auVar62._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar61._40_4_;
        auVar62._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar61._44_4_;
        auVar62._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar61._48_4_;
        auVar62._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar61._52_4_;
        auVar62._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar61._56_4_;
        auVar62._60_4_ = (uint)(bVar12 >> 7) * auVar61._60_4_;
        auVar61 = vaddps_avx512f(auVar63,auVar80);
        auVar80 = vsubps_avx512f(auVar80,auVar63);
        auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R15));
        auVar64._0_4_ =
             (uint)(bVar11 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar40._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar9 * auVar63._4_4_ | (uint)!bVar9 * auVar40._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar9 * auVar63._8_4_ | (uint)!bVar9 * auVar40._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar64._12_4_ = (uint)bVar9 * auVar63._12_4_ | (uint)!bVar9 * auVar40._12_4_;
        auVar64._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar63._16_4_;
        auVar64._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar63._20_4_;
        auVar64._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar63._24_4_;
        auVar64._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar63._28_4_;
        auVar64._32_4_ = (uint)(bVar12 & 1) * auVar63._32_4_;
        auVar64._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar63._36_4_;
        auVar64._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar63._40_4_;
        auVar64._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar63._44_4_;
        auVar64._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar63._48_4_;
        auVar64._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar63._52_4_;
        auVar64._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar63._56_4_;
        auVar64._60_4_ = (uint)(bVar12 >> 7) * auVar63._60_4_;
        auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + Rows));
        auVar65._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar63._4_4_;
        auVar65._0_4_ = (uint)(bVar11 & 1) * auVar63._0_4_;
        auVar65._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar63._8_4_;
        auVar65._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar63._12_4_;
        auVar65._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar63._16_4_;
        auVar65._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar63._20_4_;
        auVar65._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar63._24_4_;
        auVar65._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar63._28_4_;
        auVar65._32_4_ = (uint)(bVar12 & 1) * auVar63._32_4_;
        auVar65._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar63._36_4_;
        auVar65._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar63._40_4_;
        auVar65._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar63._44_4_;
        auVar65._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar63._48_4_;
        auVar65._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar63._52_4_;
        auVar65._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar63._56_4_;
        auVar65._60_4_ = (uint)(bVar12 >> 7) * auVar63._60_4_;
        auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX));
        auVar66._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar63._4_4_;
        auVar66._0_4_ = (uint)(bVar11 & 1) * auVar63._0_4_;
        auVar66._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar63._8_4_;
        auVar66._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar63._12_4_;
        auVar66._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar63._16_4_;
        auVar66._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar63._20_4_;
        auVar66._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar63._24_4_;
        auVar66._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar63._28_4_;
        auVar66._32_4_ = (uint)(bVar12 & 1) * auVar63._32_4_;
        auVar66._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar63._36_4_;
        auVar66._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar63._40_4_;
        auVar66._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar63._44_4_;
        auVar66._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar63._48_4_;
        auVar66._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar63._52_4_;
        auVar66._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar63._56_4_;
        auVar66._60_4_ = (uint)(bVar12 >> 7) * auVar63._60_4_;
        auVar63 = vsubps_avx512f(auVar67,auVar59);
        auVar67 = vaddps_avx512f(auVar59,auVar67);
        auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBX));
        auVar68._0_4_ =
             (uint)(bVar11 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar41._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar9 * auVar89._4_4_ | (uint)!bVar9 * auVar41._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar9 * auVar89._8_4_ | (uint)!bVar9 * auVar41._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar9 * auVar89._12_4_ | (uint)!bVar9 * auVar41._12_4_;
        auVar68._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
        auVar68._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
        auVar68._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
        auVar68._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
        auVar68._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
        auVar68._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
        auVar68._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
        auVar68._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
        auVar68._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
        auVar68._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
        auVar68._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
        auVar68._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
        auVar89 = vsubps_avx512f(auVar58,auVar60);
        auVar90 = vaddps_avx512f(auVar60,auVar58);
        auVar81 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar13));
        auVar69._0_4_ =
             (uint)(bVar11 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar42._0_4_;
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar69._4_4_ = (uint)bVar9 * auVar81._4_4_ | (uint)!bVar9 * auVar42._4_4_;
        bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar69._8_4_ = (uint)bVar9 * auVar81._8_4_ | (uint)!bVar9 * auVar42._8_4_;
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar69._12_4_ = (uint)bVar9 * auVar81._12_4_ | (uint)!bVar9 * auVar42._12_4_;
        auVar69._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar81._16_4_;
        auVar69._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar81._20_4_;
        auVar69._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar81._24_4_;
        auVar69._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar81._28_4_;
        auVar69._32_4_ = (uint)(bVar12 & 1) * auVar81._32_4_;
        auVar69._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar81._36_4_;
        auVar69._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar81._40_4_;
        auVar69._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar81._44_4_;
        auVar69._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar81._48_4_;
        auVar69._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar81._52_4_;
        auVar69._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar81._56_4_;
        auVar69._60_4_ = (uint)(bVar12 >> 7) * auVar81._60_4_;
        auVar81 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + (long)BRLow));
        auVar70._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar81._4_4_;
        auVar70._0_4_ = (uint)(bVar11 & 1) * auVar81._0_4_;
        auVar70._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar81._8_4_;
        auVar70._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar81._12_4_;
        auVar70._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar81._16_4_;
        auVar70._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar81._20_4_;
        auVar70._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar81._24_4_;
        auVar70._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar81._28_4_;
        auVar70._32_4_ = (uint)(bVar12 & 1) * auVar81._32_4_;
        auVar70._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar81._36_4_;
        auVar70._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar81._40_4_;
        auVar70._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar81._44_4_;
        auVar70._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar81._48_4_;
        auVar70._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar81._52_4_;
        auVar70._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar81._56_4_;
        auVar70._60_4_ = (uint)(bVar12 >> 7) * auVar81._60_4_;
        auVar81 = vaddps_avx512f(auVar67,auVar78);
        auVar67 = vsubps_avx512f(auVar78,auVar67);
        auVar82 = vaddps_avx512f(auVar63,auVar80);
        auVar80 = vsubps_avx512f(auVar80,auVar63);
        auVar78 = vgatherdps_avx512f(*ioptr);
        auVar71._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar78._4_4_;
        auVar71._0_4_ = (uint)(bVar11 & 1) * auVar78._0_4_;
        auVar71._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar78._8_4_;
        auVar71._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar78._12_4_;
        auVar71._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar78._16_4_;
        auVar71._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar78._20_4_;
        auVar71._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar78._24_4_;
        auVar71._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar78._28_4_;
        auVar71._32_4_ = (uint)(bVar12 & 1) * auVar78._32_4_;
        auVar71._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar78._36_4_;
        auVar71._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar78._40_4_;
        auVar71._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar78._44_4_;
        auVar71._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar78._48_4_;
        auVar71._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar78._52_4_;
        auVar71._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar78._56_4_;
        auVar71._60_4_ = (uint)(bVar12 >> 7) * auVar78._60_4_;
        auVar63 = vaddps_avx512f(auVar90,auVar61);
        auVar61 = vsubps_avx512f(auVar61,auVar90);
        auVar90 = vsubps_avx512f(auVar79,auVar89);
        auVar79 = vaddps_avx512f(auVar89,auVar79);
        auVar78 = vaddps_avx512f(auVar65,auVar62);
        auVar89 = vsubps_avx512f(auVar62,auVar65);
        auVar83 = vaddps_avx512f(auVar66,auVar64);
        auVar88 = vsubps_avx512f(auVar64,auVar66);
        in_ZMM31 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
        auVar72 = vsubps_avx512f(auVar68,auVar70);
        auVar73 = vaddps_avx512f(auVar70,auVar68);
        auVar74 = vsubps_avx512f(auVar69,auVar71);
        auVar75 = vaddps_avx512f(auVar71,auVar69);
        auVar76 = vaddps_avx512f(auVar73,auVar78);
        auVar73 = vsubps_avx512f(auVar78,auVar73);
        auVar77 = vaddps_avx512f(auVar75,auVar83);
        auVar83 = vsubps_avx512f(auVar83,auVar75);
        auVar75 = vsubps_avx512f(auVar89,auVar74);
        auVar89 = vaddps_avx512f(auVar74,auVar89);
        auVar74 = vaddps_avx512f(auVar72,auVar88);
        auVar88 = vsubps_avx512f(auVar88,auVar72);
        auVar78._8_4_ = 0xbf3504f3;
        auVar78._0_8_ = 0xbf3504f3bf3504f3;
        auVar78._12_4_ = 0xbf3504f3;
        auVar78._16_4_ = 0xbf3504f3;
        auVar78._20_4_ = 0xbf3504f3;
        auVar78._24_4_ = 0xbf3504f3;
        auVar78._28_4_ = 0xbf3504f3;
        auVar78._32_4_ = 0xbf3504f3;
        auVar78._36_4_ = 0xbf3504f3;
        auVar78._40_4_ = 0xbf3504f3;
        auVar78._44_4_ = 0xbf3504f3;
        auVar78._48_4_ = 0xbf3504f3;
        auVar78._52_4_ = 0xbf3504f3;
        auVar78._56_4_ = 0xbf3504f3;
        auVar78._60_4_ = 0xbf3504f3;
        auVar78 = vmulps_avx512f(auVar88,auVar78);
        in_ZMM30 = vsubps_avx512f(auVar81,auVar76);
        auVar81 = vaddps_avx512f(auVar76,auVar81);
        in_ZMM28 = vsubps_avx512f(auVar63,auVar77);
        in_ZMM25 = vaddps_avx512f(auVar77,auVar63);
        in_ZMM29 = vsubps_avx512f(auVar67,auVar83);
        auVar63 = vaddps_avx512f(auVar83,auVar67);
        auVar67 = vaddps_avx512f(auVar73,auVar61);
        auVar61 = vsubps_avx512f(auVar61,auVar73);
        auVar89 = vmulps_avx512f(auVar89,in_ZMM31);
        auVar83 = vmulps_avx512f(auVar74,in_ZMM31);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108640,uVar30,auVar81);
        auVar81 = vaddps_avx512f(auVar78,auVar79);
        in_ZMM27 = vsubps_avx512f(auVar81,auVar89);
        auVar89 = vaddps_avx512f(auVar80,auVar89);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar63,uVar30,in_ZMM25);
        auVar78 = vaddps_avx512f(auVar78,auVar89);
        auVar89 = vmulps_avx512f(auVar75,in_ZMM31);
        auVar81 = vsubps_avx512f(auVar90,auVar83);
        auVar83 = vaddps_avx512f(auVar83,auVar82);
        in_ZMM26 = vaddps_avx512f(auVar81,auVar89);
        auVar89 = vaddps_avx512f(auVar83,auVar89);
        in_ZMM17 = vbroadcastss_avx512f(ZEXT416(0x40000000));
        in_ZMM24 = vfmsub213ps_avx512f(auVar79,in_ZMM17,in_ZMM27);
        auVar79 = vfmsub213ps_avx512f(auVar80,in_ZMM17,auVar78);
        auVar80 = vfmsub213ps_avx512f(auVar90,in_ZMM17,in_ZMM26);
        auVar90 = vfmsub213ps_avx512f(auVar82,in_ZMM17,auVar89);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108500,uVar30,in_ZMM24);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108540,uVar30,auVar79);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108400,uVar30,auVar63);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108440,uVar30,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108600,uVar30,auVar80);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108640,uVar30,auVar90);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108380,uVar30,in_ZMM30);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_001083c0,uVar30,in_ZMM28);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar89,uVar30,in_ZMM27);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108600,uVar30,auVar78);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108480,uVar30,in_ZMM29);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_001084c0,uVar30,auVar67);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108680,uVar30,in_ZMM26);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00108380,uVar30,auVar89);
        ioptr = ioptr + 0x100;
        in_ZMM21 = _DAT_00108700;
      } while (uVar13 != uVar23);
    }
    break;
  default:
    if (0 < Rows) {
      auVar78 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar79 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar24 = (uint)((int)M - (int)(M >> 0x3f)) >> 1;
      uVar13 = (ulong)((uint)((int)(M + 3) - (int)(M + 3 >> 0x3f)) >> 1);
      uVar23 = 1L << (M & 0x3fU);
      lVar28 = 1L << (uVar13 & 0x3f);
      lVar18 = uVar23 - lVar28;
      lVar25 = 1L << ((ulong)(byte)((char)uVar24 + 1) & 0x3f);
      local_168 = ioptr + ((uVar23 * 2 + 1) - lVar28);
      uVar30 = ~(-1L << ((ulong)(uVar24 - 1) & 0x3f));
      StageCnt = (M + -1) / 3;
      local_160 = ioptr + lVar28 * -2 + uVar23 * 2;
      lVar1 = M + -1 + StageCnt * -3;
      auVar80 = vpbroadcastq_avx512f();
      local_170 = ioptr + (uVar23 - lVar28);
      lVar19 = 2L << (M & 0x3fU);
      local_178 = ioptr + ((uVar23 + 1) - lVar28);
      local_158 = ioptr + lVar28 * -2 + uVar23;
      auVar57 = vmovdqu64_avx512f(auVar80);
      do {
        auVar67 = _DAT_00108700;
        auVar63 = _DAT_00108500;
        auVar61 = _DAT_00108340;
        if (0 < 4L << (uVar13 & 0x3f)) {
          local_b8 = local_178;
          local_138 = local_160;
          local_140 = local_158;
          local_148 = local_168;
          local_150 = local_170;
          uVar29 = uVar30;
          pfVar15 = ioptr;
          do {
            do {
              lVar14 = (long)BRLow[uVar29];
              pfVar21 = pfVar15 + lVar18 + lVar14 * 4;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)(pfVar15 + lVar18 + lVar14 * 4);
              auVar89 = ZEXT1664(auVar33);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(pfVar21 + uVar23);
              auVar90 = ZEXT1664(auVar34);
              if ((long)uVar29 < (long)uVar30) {
                lVar16 = uVar29 << (((M + 1) - (M + 1 >> 0x3f) >> 1) + 1U & 0x3f);
                pfVar17 = local_b8;
                pfVar20 = local_138;
                uVar22 = uVar30;
                pfVar26 = local_140;
                pfVar27 = local_148;
                pfVar21 = local_150;
                do {
                  auVar38._0_4_ = auVar89._0_4_ + auVar90._0_4_;
                  auVar38._4_4_ = auVar89._4_4_ + auVar90._4_4_;
                  auVar38._8_4_ = auVar89._8_4_ + auVar90._8_4_;
                  auVar38._12_4_ = auVar89._12_4_ + auVar90._12_4_;
                  auVar33 = vsubps_avx(auVar89._0_16_,auVar90._0_16_);
                  uVar2 = *(undefined8 *)(pfVar21 + lVar14 * 4 + 2);
                  auVar36._8_8_ = uVar2;
                  auVar36._0_8_ = uVar2;
                  lVar31 = (long)BRLow[uVar22];
                  uVar22 = uVar22 - 1;
                  pfVar17 = (float *)((long)pfVar17 + lVar28 * -4);
                  auVar33 = vmovlhps_avx(auVar38,auVar33);
                  uVar3 = *(undefined8 *)(pfVar27 + lVar14 * 4 + 1);
                  auVar39._8_8_ = uVar3;
                  auVar39._0_8_ = uVar3;
                  uVar4 = *(ulong *)(pfVar15 + lVar16 + lVar31 * 4 + uVar23);
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar4;
                  uVar5 = *(ulong *)(pfVar15 + lVar16 + lVar31 * 4 + uVar23 + 2);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar5;
                  auVar34 = vsubps_avx(auVar36,auVar39);
                  uVar6 = *(ulong *)(pfVar15 + lVar16 + lVar31 * 4);
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar6;
                  uVar7 = *(ulong *)(pfVar15 + lVar16 + lVar31 * 4 + 2);
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar7;
                  *(undefined1 (*) [16])(pfVar15 + lVar16 + lVar31 * 4) = auVar33;
                  *(ulong *)(pfVar15 + lVar16 + lVar31 * 4 + uVar23) =
                       CONCAT44((float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar2 >> 0x20),
                                (float)uVar3 + (float)uVar2);
                  *(long *)(pfVar15 + lVar16 + lVar31 * 4 + uVar23 + 2) = auVar34._8_8_;
                  auVar92._0_4_ = (float)uVar5 + (float)uVar7;
                  auVar92._4_4_ = (float)(uVar5 >> 0x20) + (float)(uVar7 >> 0x20);
                  auVar92._8_8_ = 0;
                  auVar33 = vsubps_avx(auVar41,auVar43);
                  auVar44._0_4_ = (float)uVar4 + (float)uVar6;
                  auVar44._4_4_ = (float)(uVar4 >> 0x20) + (float)(uVar6 >> 0x20);
                  auVar44._8_8_ = 0;
                  auVar34 = vsubps_avx(auVar40,auVar42);
                  pfVar21[lVar14 * 4] = auVar44._0_4_;
                  fVar8 = (float)vextractps_avx(auVar44,1);
                  pfVar21[lVar14 * 4 + 1] = fVar8;
                  uVar2 = vmovlps_avx(auVar34);
                  *(undefined8 *)(pfVar21 + lVar14 * 4 + 2) = uVar2;
                  pfVar27[lVar14 * 4 + -1] = auVar92._0_4_;
                  fVar8 = (float)vextractps_avx(auVar92,1);
                  pfVar27[lVar14 * 4] = fVar8;
                  uVar2 = vmovlps_avx(auVar33);
                  *(undefined8 *)(pfVar27 + lVar14 * 4 + 1) = uVar2;
                  pfVar21 = pfVar21 + -lVar28;
                  pfVar27 = pfVar27 + -lVar28;
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = *(ulong *)(pfVar26 + lVar14 * 4);
                  auVar89 = ZEXT1664(auVar35);
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = *(ulong *)(pfVar20 + lVar14 * 4);
                  auVar90 = ZEXT1664(auVar37);
                  pfVar26 = pfVar26 + -lVar28;
                  pfVar20 = pfVar20 + -lVar28;
                } while ((long)uVar29 < (long)uVar22);
                pfVar21 = pfVar21 + lVar14 * 4;
                pfVar20 = pfVar27 + lVar14 * 4;
                pfVar27 = pfVar27 + lVar14 * 4 + -1;
                pfVar17 = (float *)((long)pfVar17 + lVar14 * 0x10);
                auVar33 = vmovshdup_avx(auVar37);
                fVar8 = auVar33._0_4_;
                auVar33 = vmovshdup_avx(auVar35);
                fVar10 = auVar33._0_4_;
              }
              else {
                pfVar17 = pfVar15 + lVar18 + lVar14 * 4 + 1;
                pfVar27 = pfVar21 + uVar23;
                auVar33 = vmovshdup_avx(auVar33);
                fVar10 = auVar33._0_4_;
                auVar33 = vmovshdup_avx(auVar34);
                fVar8 = auVar33._0_4_;
                pfVar20 = pfVar21 + uVar23 + 1;
              }
              uVar22 = *(ulong *)(pfVar21 + 2);
              auVar91._8_8_ = 0;
              auVar91._0_8_ = uVar22;
              uVar4 = *(ulong *)(pfVar21 + uVar23 + 2);
              auVar94._8_8_ = 0;
              auVar94._0_8_ = uVar4;
              *pfVar21 = auVar90._0_4_ + auVar89._0_4_;
              *pfVar17 = fVar8 + fVar10;
              pfVar21[2] = auVar89._0_4_ - auVar90._0_4_;
              pfVar21[3] = fVar10 - fVar8;
              auVar93._0_4_ = (float)uVar4 + (float)uVar22;
              auVar93._4_4_ = (float)(uVar4 >> 0x20) + (float)(uVar22 >> 0x20);
              auVar93._8_8_ = 0;
              auVar33 = vsubps_avx(auVar91,auVar94);
              *pfVar27 = auVar93._0_4_;
              fVar8 = (float)vextractps_avx(auVar93,1);
              *pfVar20 = fVar8;
              uVar2 = vmovlps_avx(auVar33);
              *(undefined8 *)(pfVar21 + uVar23 + 2) = uVar2;
              bVar9 = 0 < (long)uVar29;
              uVar29 = uVar29 - 1;
            } while (bVar9);
            local_150 = local_150 + lVar25;
            local_148 = local_148 + lVar25;
            local_140 = local_140 + lVar25;
            local_138 = local_138 + lVar25;
            local_b8 = (float *)((long)local_b8 + lVar25 * 4);
            pfVar15 = pfVar15 + lVar25;
            uVar29 = uVar30;
          } while (pfVar15 < ioptr + lVar28);
        }
        uVar29 = 2;
        if (lVar1 == 1) {
          uVar29 = 0;
          pfVar15 = ioptr;
          do {
            auVar89 = vpbroadcastq_avx512f();
            uVar29 = uVar29 + 0x10;
            auVar90 = vporq_avx512f(auVar89,auVar78);
            auVar89 = vporq_avx512f(auVar89,auVar79);
            uVar2 = vpcmpuq_avx512f(auVar89,auVar80,2);
            bVar11 = (byte)uVar2;
            uVar2 = vpcmpuq_avx512f(auVar90,auVar80,2);
            bVar12 = (byte)uVar2;
            uVar32 = CONCAT11(bVar12,bVar11);
            uVar22 = (ulong)uVar32;
            auVar90 = vgatherdps_avx512f(pfVar15[-lVar28]);
            auVar89._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar89._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar89._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar89._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar89._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar89._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar89._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar89._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar89._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar89._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar89._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar89._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar89._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar89._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar89._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar89._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[4 - lVar28]);
            auVar81._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar81._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar81._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar81._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar81._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar81._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar81._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar81._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar81._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar81._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar81._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar81._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar81._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar81._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar81._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar81._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[1 - lVar28]);
            auVar82._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar82._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar82._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar82._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar82._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar82._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar82._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar82._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar82._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar82._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar82._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar82._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar82._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar82._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar82._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar82._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[5 - lVar28]);
            auVar83._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar83._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar83._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar83._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar83._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar83._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar83._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar83._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar83._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar83._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar83._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar83._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar83._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar83._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar83._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar83._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[8 - lVar28]);
            auVar88._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar88._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar88._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar88._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar88._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar88._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar88._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar88._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar88._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar88._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar88._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar88._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar88._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar88._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar88._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar88._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[0xc - lVar28]);
            auVar72._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar72._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar72._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar72._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar72._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar72._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar72._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar72._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar72._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar72._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar72._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar72._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar72._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar72._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar72._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar72._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vgatherdps_avx512f(pfVar15[9 - lVar28]);
            auVar73._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar90._4_4_;
            auVar73._0_4_ = (uint)(bVar11 & 1) * auVar90._0_4_;
            auVar73._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar90._8_4_;
            auVar73._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar90._12_4_;
            auVar73._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar90._16_4_;
            auVar73._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar90._20_4_;
            auVar73._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar90._24_4_;
            auVar73._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar90._28_4_;
            auVar73._32_4_ = (uint)(bVar12 & 1) * auVar90._32_4_;
            auVar73._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar90._36_4_;
            auVar73._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar90._40_4_;
            auVar73._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar90._44_4_;
            auVar73._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar90._48_4_;
            auVar73._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar90._52_4_;
            auVar73._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar90._56_4_;
            auVar73._60_4_ = (uint)(bVar12 >> 7) * auVar90._60_4_;
            auVar90 = vaddps_avx512f(auVar81,auVar89);
            auVar89 = vsubps_avx512f(auVar89,auVar81);
            auVar81 = vgatherdps_avx512f(pfVar15[0xd - lVar28]);
            auVar74._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar81._4_4_;
            auVar74._0_4_ = (uint)(bVar11 & 1) * auVar81._0_4_;
            auVar74._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar81._8_4_;
            auVar74._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar81._12_4_;
            auVar74._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar81._16_4_;
            auVar74._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar81._20_4_;
            auVar74._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar81._24_4_;
            auVar74._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar81._28_4_;
            auVar74._32_4_ = (uint)(bVar12 & 1) * auVar81._32_4_;
            auVar74._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar81._36_4_;
            auVar74._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar81._40_4_;
            auVar74._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar81._44_4_;
            auVar74._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar81._48_4_;
            auVar74._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar81._52_4_;
            auVar74._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar81._56_4_;
            auVar74._60_4_ = (uint)(bVar12 >> 7) * auVar81._60_4_;
            auVar81 = vaddps_avx512f(auVar83,auVar82);
            auVar82 = vsubps_avx512f(auVar82,auVar83);
            vscatterdps_avx512f(ZEXT864(pfVar15) + auVar61,uVar22,auVar90);
            auVar90 = vaddps_avx512f(auVar72,auVar88);
            auVar83 = vsubps_avx512f(auVar88,auVar72);
            vscatterdps_avx512f(ZEXT864(pfVar15) + auVar67,uVar22,auVar81);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + auVar61,uVar22,auVar89);
            auVar89 = vaddps_avx512f(auVar74,auVar73);
            auVar81 = vsubps_avx512f(auVar73,auVar74);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + auVar67,uVar22,auVar82);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + auVar61,uVar22,auVar90);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + auVar67,uVar22,auVar89);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + auVar61,uVar22,auVar83);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + auVar67,uVar22,auVar81);
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 + (long)BRLow));
            auVar90._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar90._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar90._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar90._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar90._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar90._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar90._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar90._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar90._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar90._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar90._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar90._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar90._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar90._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar90._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar90._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x10));
            auVar75._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar75._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar75._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar75._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar75._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar75._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar75._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar75._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar75._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar75._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar75._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar75._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar75._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar75._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar75._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar75._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2));
            auVar76._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar76._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar76._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar76._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar76._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar76._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar76._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar76._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar76._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar76._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar76._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar76._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar76._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar76._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar76._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar76._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 4) + (long)BRLow));
            auVar77._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar77._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar77._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar77._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar77._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar77._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar77._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar77._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar77._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar77._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar77._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar77._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar77._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar77._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar77._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar77._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 8) + (long)BRLow));
            auVar84._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar84._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar84._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar84._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar84._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar84._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar84._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar84._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar84._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar84._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar84._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar84._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar84._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar84._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar84._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar84._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x30));
            auVar85._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar85._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar85._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar85._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar85._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar85._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar85._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar85._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar85._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar85._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar85._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar85._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar85._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar85._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar85._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar85._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x20));
            auVar86._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar89._4_4_;
            auVar86._0_4_ = (uint)(bVar11 & 1) * auVar89._0_4_;
            auVar86._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar89._8_4_;
            auVar86._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar89._12_4_;
            auVar86._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar89._16_4_;
            auVar86._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar89._20_4_;
            auVar86._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar89._24_4_;
            auVar86._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar89._28_4_;
            auVar86._32_4_ = (uint)(bVar12 & 1) * auVar89._32_4_;
            auVar86._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar89._36_4_;
            auVar86._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar89._40_4_;
            auVar86._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar89._44_4_;
            auVar86._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar89._48_4_;
            auVar86._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar89._52_4_;
            auVar86._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar89._56_4_;
            auVar86._60_4_ = (uint)(bVar12 >> 7) * auVar89._60_4_;
            auVar89 = vaddps_avx512f(auVar75,auVar90);
            auVar90 = vsubps_avx512f(auVar90,auVar75);
            auVar81 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 0xc) + (long)BRLow));
            auVar87._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar81._4_4_;
            auVar87._0_4_ = (uint)(bVar11 & 1) * auVar81._0_4_;
            auVar87._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar81._8_4_;
            auVar87._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar81._12_4_;
            auVar87._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar81._16_4_;
            auVar87._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar81._20_4_;
            auVar87._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar81._24_4_;
            auVar87._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar81._28_4_;
            auVar87._32_4_ = (uint)(bVar12 & 1) * auVar81._32_4_;
            auVar87._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar81._36_4_;
            auVar87._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar81._40_4_;
            auVar87._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar81._44_4_;
            auVar87._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar81._48_4_;
            auVar87._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar81._52_4_;
            auVar87._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar81._56_4_;
            auVar87._60_4_ = (uint)(bVar12 >> 7) * auVar81._60_4_;
            auVar81 = vsubps_avx512f(auVar76,auVar77);
            auVar82 = vaddps_avx512f(auVar77,auVar76);
            vscatterdps_avx512f(ZEXT864(pfVar15) + auVar63,uVar22,auVar89);
            auVar89 = vaddps_avx512f(auVar85,auVar84);
            auVar83 = vsubps_avx512f(auVar84,auVar85);
            vscatterdps_avx512f(ZEXT864(pfVar15) + auVar90,uVar22,auVar81);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + auVar63,uVar22,auVar90);
            auVar81 = vsubps_avx512f(auVar86,auVar87);
            auVar88 = vaddps_avx512f(auVar87,auVar86);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + auVar90,uVar22,auVar82);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + auVar63,uVar22,auVar89);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + auVar90,uVar22,auVar81);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + auVar63,uVar22,auVar83);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + auVar90,uVar22,auVar88);
            pfVar15 = pfVar15 + 0x100;
          } while (((uVar23 >> 3) + 0xf & 0xfffffffffffffff0) != uVar29);
          uVar29 = 4;
        }
        if (lVar1 == 2) {
          bfR4(ioptr,M,uVar29);
          uVar29 = (ulong)(uint)((int)uVar29 << 2);
        }
        if ((ulong)M < 0xc) {
          bfstages(ioptr,M,Utbl,1,uVar29,StageCnt);
        }
        else {
          fftrecurs(ioptr,M,Utbl,1,uVar29,StageCnt);
        }
        auVar80 = vmovdqu64_avx512f(auVar57);
        auVar78 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar79 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        local_170 = local_170 + lVar19;
        local_168 = local_168 + lVar19;
        local_158 = local_158 + lVar19;
        local_160 = local_160 + lVar19;
        local_178 = local_178 + lVar19;
        ioptr = ioptr + lVar19;
        bVar9 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar9);
    }
  }
  return;
}

Assistant:

void ffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		fft2pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		fft4pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		fft8pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		bitrevR2(ioptr, M, BRLow);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			bfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			fftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}